

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array2d_kernel.h
# Opt level: O0

bool __thiscall
dlib::array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_>::move_next
          (array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_> *this)

{
  array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_> *this_local;
  bool local_1;
  
  if (this->cur == (float *)0x0) {
    if ((this->at_start_ & 1U) == 0) {
      local_1 = false;
    }
    else {
      this->cur = this->data;
      this->at_start_ = false;
      local_1 = this->data != (float *)0x0;
    }
  }
  else if (this->cur == this->last) {
    this->cur = (float *)0x0;
    local_1 = false;
  }
  else {
    this->cur = this->cur + 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool move_next (
        ) const
        {
            if (cur != 0)
            {
                if (cur != last)
                {
                    ++cur;
                    return true;
                }
                cur = 0;
                return false;
            }
            else if (at_start_)
            {
                cur = data;
                at_start_ = false;
                return (data != 0);
            }
            else
            {
                return false;
            }
        }